

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

FreePageEntry * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::PopZeroPageEntry(ZeroPageQueue *this)

{
  FreePageEntry *pFVar1;
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  
  local_20.cs = &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection;
  CCLock::Enter(&(local_20.cs)->super_CCLock);
  pFVar1 = this->pendingZeroPageList;
  if (pFVar1 != (FreePageEntry *)0x0) {
    this->pendingZeroPageList = pFVar1->Next;
  }
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return pFVar1;
}

Assistant:

FreePageEntry* PopZeroPageEntry()
        {
#if SUPPORT_WIN32_SLIST
            return (FreePageEntry *)::InterlockedPopEntrySList(&pendingZeroPageList);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            FreePageEntry* head = pendingZeroPageList;
            if (head)
            {
                pendingZeroPageList = pendingZeroPageList->Next;
            }
            return head;
#endif
        }